

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int ShouldCompress(uint8_t *data,size_t mask,uint64_t last_flush_pos,size_t bytes,
                  size_t num_literals,size_t num_commands)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 uVar10;
  undefined1 auVar9 [16];
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  uint32_t literal_histo [256];
  int local_428 [256];
  
  if ((num_commands < (bytes >> 8) + 2) &&
     (auVar7._8_4_ = (int)(num_literals >> 0x20), auVar7._0_8_ = num_literals,
     auVar7._12_4_ = 0x45300000, auVar8._8_4_ = (int)(bytes >> 0x20), auVar8._0_8_ = bytes,
     auVar8._12_4_ = 0x45300000,
     dVar11 = (auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)bytes) - 4503599627370496.0),
     dVar11 * 0.99 <
     (auVar7._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)num_literals) - 4503599627370496.0))) {
    memset(local_428,0,0x400);
    if (0xc < bytes + 0xc) {
      uVar1 = (bytes + 0xc) / 0xd;
      do {
        local_428[data[(uint)last_flush_pos & (uint)mask]] =
             local_428[data[(uint)last_flush_pos & (uint)mask]] + 1;
        last_flush_pos = (uint64_t)((uint)last_flush_pos + 0xd);
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
    dVar12 = 0.0;
    uVar4 = 0xfffffffffffffff8;
    uVar1 = 0;
    do {
      uVar2 = (ulong)*(uint *)((long)local_428 + uVar4 + 8);
      if (uVar2 < 0x100) {
        dVar6 = (double)kLog2Table[uVar2];
      }
      else {
        dVar6 = log2((double)uVar2);
      }
      uVar3 = (ulong)*(uint *)((long)local_428 + uVar4 + 0xc);
      if (uVar3 < 0x100) {
        dVar5 = (double)kLog2Table[uVar3];
      }
      else {
        dVar5 = log2((double)uVar3);
      }
      uVar1 = uVar1 + uVar2 + uVar3;
      dVar12 = (dVar12 - (double)uVar2 * dVar6) - (double)uVar3 * dVar5;
      uVar4 = uVar4 + 8;
    } while (uVar4 < 0x3f8);
    uVar10 = (undefined4)(uVar1 >> 0x20);
    if (uVar1 != 0) {
      auVar9._8_4_ = uVar10;
      auVar9._0_8_ = uVar1;
      auVar9._12_4_ = 0x45300000;
      dVar6 = (auVar9._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      if (uVar1 < 0x100) {
        dVar5 = (double)kLog2Table[uVar1];
      }
      else {
        dVar5 = log2(dVar6);
      }
      dVar12 = dVar12 + dVar6 * dVar5;
    }
    auVar13._8_4_ = uVar10;
    auVar13._0_8_ = uVar1;
    auVar13._12_4_ = 0x45300000;
    dVar6 = (auVar13._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    if (dVar6 <= dVar12) {
      dVar6 = dVar12;
    }
    if ((dVar11 * 7.92) / 13.0 < dVar6) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static BROTLI_BOOL ShouldCompress(
    const uint8_t* data, const size_t mask, const uint64_t last_flush_pos,
    const size_t bytes, const size_t num_literals, const size_t num_commands) {
  if (num_commands < (bytes >> 8) + 2) {
    if (num_literals > 0.99 * (double)bytes) {
      uint32_t literal_histo[256] = { 0 };
      static const uint32_t kSampleRate = 13;
      static const double kMinEntropy = 7.92;
      const double bit_cost_threshold =
          (double)bytes * kMinEntropy / kSampleRate;
      size_t t = (bytes + kSampleRate - 1) / kSampleRate;
      uint32_t pos = (uint32_t)last_flush_pos;
      size_t i;
      for (i = 0; i < t; i++) {
        ++literal_histo[data[pos & mask]];
        pos += kSampleRate;
      }
      if (BitsEntropy(literal_histo, 256) > bit_cost_threshold) {
        return BROTLI_FALSE;
      }
    }
  }
  return BROTLI_TRUE;
}